

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.cc
# Opt level: O2

void __thiscall
mp::internal::TextReader<fmt::Locale>::ReadHeader(TextReader<fmt::Locale> *this,NLHeader *header)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  unsigned_long uVar7;
  int i;
  long lVar8;
  double dVar9;
  int arith_kind;
  int max_vars;
  undefined8 local_38;
  int local_2c;
  
  pcVar3 = (this->super_ReaderBase).ptr_;
  (this->super_ReaderBase).token_ = pcVar3;
  (this->super_ReaderBase).ptr_ = pcVar3 + 1;
  if (*pcVar3 == 'b') {
    (header->super_NLInfo).super_NLInfo_C.format = 1;
  }
  else if (*pcVar3 == 'g') {
    (header->super_NLInfo).super_NLInfo_C.format = 0;
  }
  else {
    ReportError<>(this,(CStringRef)0x20f222);
  }
  piVar1 = &(header->super_NLInfo).super_NLInfo_C.num_ampl_options;
  ReadOptionalUInt(this,piVar1);
  if (9 < (header->super_NLInfo).super_NLInfo_C.num_ampl_options) {
    ReportError<>(this,(CStringRef)0x20f3ba);
  }
  lVar8 = 0;
  while (lVar8 < *piVar1) {
    bVar5 = ReadOptionalDouble(this,(double *)&local_38);
    if (!bVar5) break;
    dVar4 = (double)CONCAT44(local_38._4_4_,(int)local_38);
    dVar9 = (double)(long)dVar4;
    (header->super_NLInfo).super_NLInfo_C.ampl_options[lVar8] = (long)dVar4;
    lVar8 = lVar8 + 1;
    if ((dVar4 != dVar9) || (NAN(dVar4) || NAN(dVar9))) break;
  }
  if ((header->super_NLInfo).super_NLInfo_C.ampl_options[1] == 3) {
    ReadOptionalDouble(this,&(header->super_NLInfo).super_NLInfo_C.ampl_vbtol);
  }
  ReadTillEndOfLine(this);
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_vars = iVar6;
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons = iVar6;
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_objs = iVar6;
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_eqns = -1;
  bVar5 = ReadOptionalUInt(this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_ranges);
  if (bVar5) {
    bVar5 = ReadOptionalUInt(this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_eqns);
    if (bVar5) {
      ReadOptionalUInt(this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
    }
  }
  ReadTillEndOfLine(this);
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_cons = iVar6;
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_objs = iVar6;
  bVar5 = ReadOptionalUInt(this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds
                          );
  if (bVar5) {
    bVar5 = ReadOptionalUInt(this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.
                                   num_nl_compl_conds);
    if (bVar5) {
      bVar5 = ReadOptionalUInt(this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.
                                     num_compl_dbl_ineqs);
      if (bVar5) {
        bVar5 = ReadOptionalUInt(this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.
                                       num_compl_vars_with_nz_lb);
        goto LAB_001518eb;
      }
    }
  }
  bVar5 = false;
LAB_001518eb:
  iVar2 = (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_compl_conds;
  piVar1 = &(header->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_conds;
  iVar6 = *piVar1;
  *piVar1 = *piVar1 + iVar2;
  if ((*piVar1 != 0 && SCARRY4(iVar6,iVar2) == *piVar1 < 0) && bVar5 == false) {
    (header->super_NLProblemInfo).super_NLProblemInfo_C.num_compl_dbl_ineqs = -1;
  }
  ReadTillEndOfLine(this);
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_net_cons = iVar6;
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_cons = iVar6;
  ReadTillEndOfLine(this);
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_cons = iVar6;
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_objs = iVar6;
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both = -1;
  ReadOptionalUInt(this,&(header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both);
  ReadTillEndOfLine(this);
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_net_vars = iVar6;
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs = iVar6;
  local_38._0_4_ = 0;
  bVar5 = ReadOptionalUInt(this,(int *)&local_38);
  if (bVar5) {
    if (5 < (int)local_38) {
      ReportError<>(this,(CStringRef)0x20f8ef);
    }
    (header->super_NLInfo).super_NLInfo_C.arith_kind = (int)local_38;
    ReadOptionalUInt(this,&(header->super_NLInfo).super_NLInfo_C.flags);
  }
  ReadTillEndOfLine(this);
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_binary_vars = iVar6;
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_linear_integer_vars = iVar6;
  if (-1 < (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_vars_in_both) {
    iVar6 = ReadUInt<int>(this);
    (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_both = iVar6;
    iVar6 = ReadUInt<int>(this);
    (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_cons = iVar6;
    iVar6 = ReadUInt<int>(this);
    (header->super_NLProblemInfo).super_NLProblemInfo_C.num_nl_integer_vars_in_objs = iVar6;
  }
  ReadTillEndOfLine(this);
  uVar7 = ReadUInt<unsigned_long>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_con_nonzeros = uVar7;
  uVar7 = ReadUInt<unsigned_long>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_obj_nonzeros = uVar7;
  ReadTillEndOfLine(this);
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.max_con_name_len = iVar6;
  iVar6 = ReadUInt<int>(this);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.max_var_name_len = iVar6;
  ReadTillEndOfLine(this);
  local_2c = (header->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  iVar6 = ReadUInt(this,&local_2c);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both = iVar6;
  iVar6 = ReadUInt(this,&local_2c);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons = iVar6;
  iVar6 = ReadUInt(this,&local_2c);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs = iVar6;
  iVar6 = ReadUInt(this,&local_2c);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons = iVar6;
  iVar6 = ReadUInt(this,&local_2c);
  (header->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs = iVar6;
  ReadTillEndOfLine(this);
  return;
}

Assistant:

void mp::internal::TextReader<Locale>::ReadHeader(NLHeader &header) {
  // Read the format (text or binary).
  switch (ReadChar()) {
  case 'g':
    header.format = NLHeader::TEXT;
    break;
  case 'b':
    header.format = NLHeader::BINARY;
    break;
  default:
    ReportError("expected format specifier");
    break;
  }

  // Read options.
  ReadOptionalUInt(header.num_ampl_options);
  if (header.num_ampl_options > MAX_AMPL_OPTIONS)
    ReportError("too many options");
  for (int i = 0; i < header.num_ampl_options; ++i) {
    double tmp;
    if (!ReadOptionalDouble(tmp))
      break;
    header.ampl_options[i] = (long)tmp;
    if (header.ampl_options[i] != tmp)
      break;
  }
  if (header.ampl_options[USE_VBTOL_OPTION] == READ_VBTOL)
    ReadOptionalDouble(header.ampl_vbtol);
  ReadTillEndOfLine();

  // Read problem dimensions.
  header.num_vars = ReadUInt();
  header.num_algebraic_cons = ReadUInt();
  header.num_objs = ReadUInt();
  header.num_eqns = -1;
  if (ReadOptionalUInt(header.num_ranges) &&
      ReadOptionalUInt(header.num_eqns)) {
      ReadOptionalUInt(header.num_logical_cons);
  }
  ReadTillEndOfLine();

  // Read the nonlinear and complementarity information.
  header.num_nl_cons = ReadUInt();
  header.num_nl_objs = ReadUInt();
  bool all_compl =
      ReadOptionalUInt(header.num_compl_conds) &&
      ReadOptionalUInt(header.num_nl_compl_conds) &&
      ReadOptionalUInt(header.num_compl_dbl_ineqs) &&
      ReadOptionalUInt(header.num_compl_vars_with_nz_lb);
  header.num_compl_conds += header.num_nl_compl_conds;
  if (header.num_compl_conds > 0 && !all_compl)
    header.num_compl_dbl_ineqs = -1;
  ReadTillEndOfLine();

  // Read the information about network constraints.
  header.num_nl_net_cons = ReadUInt();
  header.num_linear_net_cons = ReadUInt();
  ReadTillEndOfLine();

  // Read the information about nonlinear variables.
  header.num_nl_vars_in_cons = ReadUInt();
  header.num_nl_vars_in_objs = ReadUInt();
  header.num_nl_vars_in_both = -1;
  ReadOptionalUInt(header.num_nl_vars_in_both);
  ReadTillEndOfLine();

  header.num_linear_net_vars = ReadUInt();
  header.num_funcs = ReadUInt();
  int arith_kind = 0;
  if (ReadOptionalUInt(arith_kind)) {
    if (arith_kind > arith::LAST)
      ReportError("unknown floating-point arithmetic kind");
    header.arith_kind = arith_kind;
    ReadOptionalUInt(header.flags);
  }
  ReadTillEndOfLine();

  // Read the information about discrete variables.
  header.num_linear_binary_vars = ReadUInt();
  header.num_linear_integer_vars = ReadUInt();
  if (header.num_nl_vars_in_both >= 0) {  // ampl versions >= 19930630
    header.num_nl_integer_vars_in_both = ReadUInt();
    header.num_nl_integer_vars_in_cons = ReadUInt();
    header.num_nl_integer_vars_in_objs = ReadUInt();
  }
  ReadTillEndOfLine();

  // Read the information about nonzeros.
  header.num_con_nonzeros = ReadUInt<std::size_t>();
  header.num_obj_nonzeros = ReadUInt<std::size_t>();
  ReadTillEndOfLine();

  // Read the information about names.
  header.max_con_name_len = ReadUInt();
  header.max_var_name_len = ReadUInt();
  ReadTillEndOfLine();

  // Read the information about common expressions checking for overflow
  // as the variable indices go from 0 to num_vars + num_common_exprs.
  int max_vars = header.num_vars;
  header.num_common_exprs_in_both = ReadUInt(max_vars);
  header.num_common_exprs_in_cons = ReadUInt(max_vars);
  header.num_common_exprs_in_objs = ReadUInt(max_vars);
  header.num_common_exprs_in_single_cons = ReadUInt(max_vars);
  header.num_common_exprs_in_single_objs = ReadUInt(max_vars);
  ReadTillEndOfLine();
}